

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

JavascriptExceptionObject * __thiscall
Js::ScriptContext::GetAndClearRecordedException(ScriptContext *this,bool *considerPassingToDebugger)

{
  code *pcVar1;
  bool bVar2;
  RecyclableData *pRVar3;
  undefined4 *puVar4;
  JavascriptExceptionObject *pJVar5;
  
  pRVar3 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                     (&this->threadContext->recyclableData);
  pJVar5 = (pRVar3->exceptionObject).ptr;
  if (pJVar5 == (JavascriptExceptionObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xb1c,"(exceptionObject != nullptr)","exceptionObject != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (considerPassingToDebugger != (bool *)0x0) {
    pRVar3 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->threadContext->recyclableData);
    *considerPassingToDebugger = pRVar3->propagateException;
  }
  pJVar5 = JavascriptExceptionObject::CloneIfStaticExceptionObject(pJVar5,this);
  ThreadContext::SetRecordedException(this->threadContext,(JavascriptExceptionObject *)0x0,false);
  return pJVar5;
}

Assistant:

Js::JavascriptExceptionObject * ScriptContext::GetAndClearRecordedException(bool *considerPassingToDebugger)
    {
        JavascriptExceptionObject * exceptionObject = this->threadContext->GetRecordedException();
        Assert(exceptionObject != nullptr);
        if (considerPassingToDebugger)
        {
            *considerPassingToDebugger = this->threadContext->GetPropagateException();
        }
        exceptionObject = exceptionObject->CloneIfStaticExceptionObject(this);
        this->threadContext->SetRecordedException(nullptr);
        return exceptionObject;
    }